

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix * __thiscall Matrix::operator=(Matrix *this,Matrix *other)

{
  Matrix *other_local;
  Matrix *this_local;
  
  if (this != other) {
    this->rows = other->rows;
    this->cols = other->cols;
    std::swap<double*>(&this->data,&other->data);
  }
  return this;
}

Assistant:

Matrix& Matrix::operator=(Matrix&& other) noexcept
{
    if (this == &other)
        return *this;

    rows = other.rows;
    cols = other.cols;
    std::swap(data, other.data);

    return *this;
}